

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

Value * __thiscall
Json::ValueIteratorBase::key(Value *__return_storage_ptr__,ValueIteratorBase *this)

{
  ValueHolder VVar1;
  CZString czstring;
  CZString local_20;
  
  Value::CZString::CZString(&local_20,(CZString *)((this->current_)._M_node + 1));
  VVar1.int_._4_4_ = 0;
  VVar1.uint_._0_4_ = local_20.field_1.index_;
  if (local_20.cstr_ == (char *)0x0) {
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x8 & 0xfe00 | 2;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    __return_storage_ptr__->value_ = VVar1;
  }
  else if ((local_20.field_1.index_ & 3) == 0) {
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x8 & 0xfe00 | 4;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    (__return_storage_ptr__->value_).string_ = local_20.cstr_;
  }
  else {
    Value::Value(__return_storage_ptr__,local_20.cstr_,
                 local_20.cstr_ + (local_20.field_1.index_ >> 2));
  }
  Value::CZString::~CZString(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Value ValueIteratorBase::key() const {
  const Value::CZString czstring = (*current_).first;
  if (czstring.data()) {
    if (czstring.isStaticString())
      return Value(StaticString(czstring.data()));
    return Value(czstring.data(), czstring.data() + czstring.length());
  }
  return Value(czstring.index());
}